

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax(UnaryPropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  AssertionExpr *this_00;
  int iVar1;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar2;
  bitmask<slang::ast::ASTFlags> addedFlags;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_64;
  ASTContext local_60;
  
  local_64 = getUnaryOp((syntax->op).kind);
  addedFlags.m_bits = 0x400000;
  if (local_64 != NextTime) {
    addedFlags.m_bits = (underlying_type)((~local_64 & 1) << 0x15);
  }
  this = ((context->scope).ptr)->compilation;
  this_00 = (AssertionExpr *)(syntax->expr).ptr;
  ASTContext::resetFlags(&local_60,context,addedFlags);
  iVar1 = AssertionExpr::bind(this_00,(int)&local_60,(sockaddr *)0x0,0);
  pUVar2 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
                     (&this->super_BumpAllocator,&local_64,
                      (AssertionExpr *)CONCAT44(extraout_var,iVar1),(nullopt_t *)&std::nullopt);
  return &pUVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto op = getUnaryOp(syntax.op.kind);

    bitmask<ASTFlags> extraFlags;
    if (op == UnaryAssertionOperator::NextTime)
        extraFlags = ASTFlags::PropertyTimeAdvance;
    else if (isNegationOp(op))
        extraFlags = ASTFlags::PropertyNegation;

    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));
    return *comp.emplace<UnaryAssertionExpr>(op, expr, std::nullopt);
}